

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O3

bool __thiscall bidirectional::BiDirectional::checkBounds(BiDirectional *this,Directions *direction)

{
  double *pdVar1;
  double dVar2;
  Params *pPVar3;
  long lVar4;
  
  pPVar3 = (this->params_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
           .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl;
  if (*direction == FWD) {
    lVar4 = (long)pPVar3->critical_res;
    if (*(double *)
         (*(long *)((long)(((this->fwd_search_ptr_)._M_t.
                            super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                            .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl)->
                          current_label).
                          super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   0x10) + lVar4 * 8) <=
        (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4]) {
      return false;
    }
  }
  else if (*direction == BWD) {
    lVar4 = (long)pPVar3->critical_res;
    dVar2 = *(double *)
             (*(long *)((long)(((this->bwd_search_ptr_)._M_t.
                                super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                                .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl)
                              ->current_label).
                              super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x10) + lVar4 * 8);
    pdVar1 = (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar4;
    if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
      return false;
    }
  }
  else {
    lVar4 = (long)pPVar3->critical_res;
  }
  dVar2 = (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4];
  pdVar1 = (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + lVar4;
  if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
    return pPVar3->direction == BOTH;
  }
  return false;
}

Assistant:

bool BiDirectional::checkBounds(const Directions& direction) {
  // Check resource bounds
  Search*    search_ptr = getSearchPtr(direction);
  const int& c_res      = params_ptr_->critical_res;

  if ((direction == FWD &&
       search_ptr->current_label->resource_consumption[c_res] <=
           max_res_curr_[c_res]) ||
      (direction == BWD &&
       search_ptr->current_label->resource_consumption[c_res] >
           min_res_curr_[c_res]) ||
      max_res_curr_[c_res] != min_res_curr_[c_res]) {
    return false;
  }
  // only stop if search is being performed in both directions
  else if (params_ptr_->direction == BOTH) {
    return true;
  }
  return false;
}